

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_random_bits_fn(size_t bits,random_read_fn_t random_read)

{
  ulong factor1;
  byte *ptr;
  mp_int *pmVar1;
  ptrlen bytes_00;
  mp_int *toret;
  uint8_t *randbuf;
  size_t bytes;
  random_read_fn_t random_read_local;
  size_t bits_local;
  
  factor1 = bits + 7 >> 3;
  ptr = (byte *)safemalloc(factor1,1,0);
  (*random_read)(ptr,factor1);
  if (factor1 != 0) {
    *ptr = *ptr & (char)(2 << ((char)bits - 1U & 7)) - 1U;
  }
  bytes_00 = make_ptrlen(ptr,factor1);
  pmVar1 = mp_from_bytes_be(bytes_00);
  smemclr(ptr,factor1);
  safefree(ptr);
  return pmVar1;
}

Assistant:

mp_int *mp_random_bits_fn(size_t bits, random_read_fn_t random_read)
{
    size_t bytes = (bits + 7) / 8;
    uint8_t *randbuf = snewn(bytes, uint8_t);
    random_read(randbuf, bytes);
    if (bytes)
        randbuf[0] &= (2 << ((bits-1) & 7)) - 1;
    mp_int *toret = mp_from_bytes_be(make_ptrlen(randbuf, bytes));
    smemclr(randbuf, bytes);
    sfree(randbuf);
    return toret;
}